

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zeCommandListAppendWriteGlobalTimestampPrologue
          (ZEHandleLifetimeValidation *this,ze_command_list_handle_t hCommandList,uint64_t *dstptr,
          ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  bool bVar1;
  pointer pHVar2;
  ulong local_48;
  size_t i;
  ze_event_handle_t *phWaitEvents_local;
  uint32_t numWaitEvents_local;
  ze_event_handle_t hSignalEvent_local;
  uint64_t *dstptr_local;
  ze_command_list_handle_t hCommandList_local;
  ZEHandleLifetimeValidation *this_local;
  
  pHVar2 = std::
           unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
           ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                         *)(context + 0xd48));
  bVar1 = HandleLifetimeValidation::isHandleValid(pHVar2,hCommandList);
  if (bVar1) {
    pHVar2 = std::
             unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
             ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                           *)(context + 0xd48));
    bVar1 = HandleLifetimeValidation::isOpen(pHVar2,hCommandList);
    if (bVar1) {
      if (hSignalEvent != (ze_event_handle_t)0x0) {
        pHVar2 = std::
                 unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                 ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                               *)(context + 0xd48));
        bVar1 = HandleLifetimeValidation::isHandleValid(pHVar2,hSignalEvent);
        if (!bVar1) {
          return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
      }
      for (local_48 = 0; phWaitEvents != (ze_event_handle_t *)0x0 && local_48 < numWaitEvents;
          local_48 = local_48 + 1) {
        pHVar2 = std::
                 unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                 ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                               *)(context + 0xd48));
        bVar1 = HandleLifetimeValidation::isHandleValid(pHVar2,phWaitEvents[local_48]);
        if (!bVar1) {
          return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
      }
      this_local._4_4_ = ZE_RESULT_SUCCESS;
    }
    else {
      this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ARGUMENT;
    }
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zeCommandListAppendWriteGlobalTimestampPrologue(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint64_t* dstptr,                               ///< [in,out] pointer to memory where timestamp value will be written; must
                                                        ///< be 8byte-aligned.
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before executing query;
                                                        ///< must be 0 if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before executing query
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hCommandList )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if (!context.handleLifetime->isOpen( hCommandList )){
            return ZE_RESULT_ERROR_INVALID_ARGUMENT;
        }
        if (hSignalEvent && !context.handleLifetime->isHandleValid( hSignalEvent )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        for (size_t i = 0; ( nullptr != phWaitEvents) && (i < numWaitEvents); ++i){
            if (!context.handleLifetime->isHandleValid( phWaitEvents[i] )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
            }
        }
        return ZE_RESULT_SUCCESS;
    }